

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_concat(FuncState *fs,int *l1,int l2)

{
  int iVar1;
  int local_20;
  int next;
  int list;
  int l2_local;
  int *l1_local;
  FuncState *fs_local;
  
  if (l2 != -1) {
    if (*l1 == -1) {
      *l1 = l2;
    }
    else {
      iVar1 = *l1;
      do {
        local_20 = iVar1;
        iVar1 = getjump(fs,local_20);
      } while (iVar1 != -1);
      fixjump(fs,local_20,l2);
    }
  }
  return;
}

Assistant:

void luaK_concat (FuncState *fs, int *l1, int l2) {
  if (l2 == NO_JUMP) return;  /* nothing to concatenate? */
  else if (*l1 == NO_JUMP)  /* no original list? */
    *l1 = l2;  /* 'l1' points to 'l2' */
  else {
    int list = *l1;
    int next;
    while ((next = getjump(fs, list)) != NO_JUMP)  /* find last element */
      list = next;
    fixjump(fs, list, l2);  /* last element links to 'l2' */
  }
}